

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedCopyImage::Run(AdvancedCopyImage *this)

{
  bool bVar1;
  GLint GVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  CallLogWrapper *this_00;
  Vector<float,_4> local_9c;
  Vector<float,_4> local_8c;
  int local_7c;
  int local_78;
  int w;
  int h;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> rdata;
  allocator<tcu::Vector<float,_4>_> local_41;
  Vector<float,_4> local_40;
  undefined1 local_30 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  AdvancedCopyImage_conflict *this_local;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  glu::CallLogWrapper::glUseProgram(this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat)
  ;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat,"g_input_image"
                    );
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,0);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat,
                     "g_output_image");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,1);
  iVar3 = ShaderImageLoadStoreBase::getWindowWidth((ShaderImageLoadStoreBase *)this);
  iVar4 = ShaderImageLoadStoreBase::getWindowHeight((ShaderImageLoadStoreBase *)this);
  tcu::Vector<float,_4>::Vector(&local_40,7.0);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_41);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30,
             (long)(iVar3 * iVar4),&local_40,&local_41);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_41);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0x2801,0x2601);
  iVar3 = ShaderImageLoadStoreBase::getWindowWidth((ShaderImageLoadStoreBase *)this);
  iVar4 = ShaderImageLoadStoreBase::getWindowHeight((ShaderImageLoadStoreBase *)this);
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_30,0);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0,0x8814,iVar3,iVar4,0,0x1908,0x1406,pvVar6);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,*(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0x2801,0x2601);
  iVar3 = ShaderImageLoadStoreBase::getWindowWidth((ShaderImageLoadStoreBase *)this);
  iVar4 = ShaderImageLoadStoreBase::getWindowHeight((ShaderImageLoadStoreBase *)this);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0,0x8814,iVar3,iVar4,0,0x1908,0x1406,(void *)0x0);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget,0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,*(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4),0,'\0',0,0x88b9
             ,0x8814);
  glu::CallLogWrapper::glClear
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x4000);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,*(GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
  glu::CallLogWrapper::glDrawElementsInstancedBaseInstance
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,5,4,0x1403,(void *)0x0,1,0);
  iVar3 = ShaderImageLoadStoreBase::getWindowWidth((ShaderImageLoadStoreBase *)this);
  iVar4 = ShaderImageLoadStoreBase::getWindowHeight((ShaderImageLoadStoreBase *)this);
  std::allocator<tcu::Vector<float,_4>_>::allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&w + 3));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&h,
             (long)(iVar3 * iVar4),(allocator<tcu::Vector<float,_4>_> *)((long)&w + 3));
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&w + 3));
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,*(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&h,0
                     );
  glu::CallLogWrapper::glGetTexImage
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0,0x1908,0x1406,pvVar6);
  local_78 = 0;
  do {
    iVar3 = local_78;
    iVar4 = ShaderImageLoadStoreBase::getWindowHeight((ShaderImageLoadStoreBase *)this);
    if (iVar4 <= iVar3) {
      this_local = (AdvancedCopyImage_conflict *)0x0;
LAB_010853bf:
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&h);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30)
      ;
      return (long)this_local;
    }
    local_7c = 0;
    while( true ) {
      iVar3 = local_7c;
      iVar5 = ShaderImageLoadStoreBase::getWindowWidth((ShaderImageLoadStoreBase *)this);
      iVar4 = local_78;
      if (iVar5 <= iVar3) break;
      iVar3 = ShaderImageLoadStoreBase::getWindowWidth((ShaderImageLoadStoreBase *)this);
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          &h,(long)(iVar4 * iVar3 + local_7c));
      tcu::Vector<float,_4>::Vector(&local_8c,pvVar6);
      tcu::Vector<float,_4>::Vector(&local_9c,7.0);
      bVar1 = ShaderImageLoadStoreBase::IsEqual
                        ((ShaderImageLoadStoreBase *)this,&local_8c,&local_9c);
      if (!bVar1) {
        this_local = (AdvancedCopyImage_conflict *)&DAT_ffffffffffffffff;
        goto LAB_010853bf;
      }
      local_7c = local_7c + 1;
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

virtual long Run()
	{
		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_input_image"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_output_image"), 1);

		std::vector<vec4> data(getWindowWidth() * getWindowHeight(), vec4(7.0f));
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, getWindowWidth(), getWindowHeight(), 0, GL_RGBA, GL_FLOAT, &data[0]);

		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, getWindowWidth(), getWindowHeight(), 0, GL_RGBA, GL_FLOAT, NULL);

		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindVertexArray(m_vao);
		glDrawElementsInstancedBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1, 0);

		std::vector<vec4> rdata(getWindowWidth() * getWindowHeight());
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &rdata[0]);

		for (int h = 0; h < getWindowHeight(); ++h)
		{
			for (int w = 0; w < getWindowWidth(); ++w)
			{
				if (!IsEqual(rdata[h * getWindowWidth() + w], vec4(7.0f)))
				{
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}